

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoSimdBinop<int,int>(Thread *this,BinopFunc<int,_int> *f)

{
  int iVar1;
  u8 i;
  long lVar2;
  Simd<int,_(unsigned_char)__x04_> SVar3;
  SR result;
  Simd<int,_(unsigned_char)__x04_> lhs;
  Simd<int,_(unsigned_char)__x04_> rhs;
  Simd<int,_(unsigned_char)__x04_> local_48;
  int local_38 [4];
  int local_28 [4];
  
  local_28 = (int  [4])Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  SVar3 = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  local_38[0] = SVar3.v[0];
  local_38[1] = SVar3.v[1];
  local_38[2] = SVar3.v[2];
  local_38[3] = SVar3.v[3];
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    iVar1 = (*f)(local_38[lVar2],local_28[lVar2]);
    local_48.v[lVar2] = iVar1;
  }
  Push<wabt::interp::Simd<int,(unsigned_char)4>>(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}